

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.cpp
# Opt level: O1

int main(void)

{
  cothread_t cothread;
  long *in_FS_OFFSET;
  info i;
  long local_20;
  undefined4 local_18;
  
  cothread = diy::coroutine::co_create(0x400000,f);
  if (in_FS_OFFSET[-0x1d] == 0) {
    in_FS_OFFSET[-0x1d] = *in_FS_OFFSET + -0xe0;
  }
  local_20 = in_FS_OFFSET[-0x1d];
  local_18 = 5;
  in_FS_OFFSET[-0x1e] = (long)&local_20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Jumping to f()",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  diy::coroutine::co_switch(cothread);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Back in main",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  diy::coroutine::co_switch(cothread);
  if (cothread != (cothread_t)0x0) {
    if (*(void **)((long)cothread + 0xd0) != (void *)0x0) {
      free(*(void **)((long)cothread + 0xd0));
    }
    free(cothread);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    auto fc = dc::co_create(4*1024*1024, &f);

    info i;
    i.main = dc::co_active();
    i.arg  = 5;

    dc::argument() = &i;

    std::cout << "Jumping to f()" << std::endl;

    dc::co_switch(fc);
    std::cout << "Back in main" << std::endl;

    dc::co_switch(fc);
    dc::co_delete(fc);

    std::cout << "Done" << std::endl;
}